

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeModel::beginRemoveItems(QTreeModel *this,QTreeWidgetItem *parent,int row,int count)

{
  long i_00;
  qsizetype qVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QList<QTreeWidgetItemIterator_*> *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *unaff_retaddr;
  QTreeWidgetItemIteratorPrivate *in_stack_00000008;
  QTreeWidgetItem *c;
  int j;
  int i;
  QTreeWidgetItem *in_stack_ffffffffffffffb8;
  int local_40;
  int local_3c;
  QTreeWidgetItem *local_8;
  
  local_8 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  index((QTreeModel *)&stack0xffffffffffffffe0,(char *)in_RDI,in_ESI);
  QAbstractItemModel::beginRemoveRows((QModelIndex *)in_RDI,(int)&stack0xffffffffffffffe0,in_EDX);
  local_3c = 0;
  while( true ) {
    i_00 = (long)local_3c;
    qVar1 = QList<QTreeWidgetItemIterator_*>::size
                      ((QList<QTreeWidgetItemIterator_*> *)&in_RDI[2].d.ptr);
    if (qVar1 <= i_00) break;
    for (local_40 = 0; local_40 < in_ECX; local_40 = local_40 + 1) {
      in_stack_ffffffffffffffb8 =
           QTreeWidgetItem::child(in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
      QList<QTreeWidgetItemIterator_*>::operator[](in_RDI,i_00);
      QTreeWidgetItemIterator::d_func((QTreeWidgetItemIterator *)0x911e26);
      QTreeWidgetItemIteratorPrivate::ensureValidIterator(in_stack_00000008,unaff_retaddr);
    }
    local_3c = local_3c + 1;
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeModel::beginRemoveItems(QTreeWidgetItem *parent, int row, int count)
{
    Q_ASSERT(row >= 0);
    Q_ASSERT(count > 0);
    beginRemoveRows(index(parent, 0), row, row + count - 1);
    if (!parent)
        parent = rootItem;
    // now update the iterators
    for (int i = 0; i < iterators.size(); ++i) {
        for (int j = 0; j < count; j++) {
            QTreeWidgetItem *c = parent->child(row + j);
            iterators[i]->d_func()->ensureValidIterator(c);
        }
    }
}